

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu1_v2.c
# Opt level: O1

MPP_RET hal_h264e_vepu1_start_v2(void *hal,HalEncTask *task)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  char *fmt;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  long local_40 [3];
  undefined8 local_28;
  
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu1_v2","enter %p\n","hal_h264e_vepu1_start_v2",hal);
  }
  if (*(MppDev *)((long)hal + 8) == (MppDev)0x0) {
    _mpp_log_l(2,"hal_h264e_vepu1_v2","invalid NULL device ctx\n",(char *)0x0);
    MVar1 = MPP_NOK;
  }
  else {
    local_40[2] = (long)hal + 0x300;
    local_28 = 0x290;
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,local_40 + 2);
    if (MVar1 == MPP_OK) {
      local_40[0] = (long)hal + 0x590;
      local_40[1] = 0x290;
      MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,local_40);
      if (MVar1 == MPP_OK) {
        MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0xf,(void *)0x0);
        MVar1 = MPP_OK;
        if (MVar2 != MPP_OK) {
          _mpp_log_l(2,"hal_h264e_vepu1_v2","send cmd failed %d\n","hal_h264e_vepu1_start_v2",
                     (ulong)(uint)MVar2);
          MVar1 = MVar2;
        }
        goto LAB_00235266;
      }
      fmt = "set register read failed %d\n";
    }
    else {
      fmt = "set register write failed %d\n";
    }
    _mpp_log_l(2,"hal_h264e_vepu1_v2",fmt,"hal_h264e_vepu1_start_v2",(ulong)(uint)MVar1);
  }
LAB_00235266:
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu1_v2","leave %p\n","hal_h264e_vepu1_start_v2",hal);
  }
  return MVar1;
}

Assistant:

static MPP_RET hal_h264e_vepu1_start_v2(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_NOK;
    HalH264eVepu1Ctx *ctx = (HalH264eVepu1Ctx *)hal;
    (void)task;

    hal_h264e_dbg_func("enter %p\n", hal);

    if (ctx->dev) {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = sizeof(ctx->regs_set);

        do {
            wr_cfg.reg = &ctx->regs_set;
            wr_cfg.size = reg_size;
            wr_cfg.offset = 0;

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
            if (ret) {
                mpp_err_f("set register write failed %d\n", ret);
                break;
            }

            rd_cfg.reg = &ctx->regs_get;
            rd_cfg.size = reg_size;
            rd_cfg.offset = 0;

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
            if (ret) {
                mpp_err_f("set register read failed %d\n", ret);
                break;
            }

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
            if (ret) {
                mpp_err_f("send cmd failed %d\n", ret);
                break;
            }
        } while (0);
    } else
        mpp_err("invalid NULL device ctx\n");

    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}